

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

Boxed_Value
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::buildInt(int base,string_view t_val,bool prefixed)

{
  byte *pbVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  pointer pcVar5;
  undefined7 in_register_00000009;
  char *pcVar7;
  char *pcVar8;
  undefined4 in_register_0000003c;
  element_type *t;
  char in_R8B;
  bool bVar9;
  Boxed_Value BVar10;
  allocator<char> local_61;
  string local_60;
  string_view t_val_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  
  t = (element_type *)CONCAT44(in_register_0000003c,base);
  t_val_local._M_str = (char *)CONCAT71(in_register_00000009,prefixed);
  t_val_local._M_len = (size_t)t_val._M_str;
  bVar3 = false;
  bVar2 = false;
  pcVar7 = (char *)t_val_local._M_len;
  bVar4 = false;
  while (bVar9 = bVar4, pcVar8 = pcVar7 + -1, pcVar7 != (char *)0x0) {
    pbVar1 = (byte *)(t_val_local._M_str + -1 + (long)pcVar7);
    pcVar7 = pcVar8;
    bVar4 = true;
    if ((*pbVar1 & 0xdf) != 0x55) {
      if ((*pbVar1 & 0xdf) != 0x4c) break;
      if (bVar2) {
        bVar3 = true;
      }
      bVar2 = true;
      bVar4 = bVar9;
    }
  }
  if (in_R8B != '\0') {
    t_val_local._M_str = t_val_local._M_str + 2;
    t_val_local._M_len = t_val_local._M_len + -2;
  }
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_60,&t_val_local,&local_61);
  pcVar5 = (pointer)Catch::clara::std::__cxx11::stoll(&local_60,(size_t *)0x0,(int)t_val._M_len);
  std::__cxx11::string::~string((string *)&local_60);
  local_60._M_dataplus._M_p._0_4_ = (int)pcVar5;
  local_60._M_dataplus._M_p = pcVar5;
  if (bVar9) {
    if ((bool)((ulong)pcVar5 >> 0x20 != 0 | bVar2)) {
      if (bVar3) {
        BVar10 = detail::const_var_impl<unsigned_long_long>((unsigned_long_long *)t);
        _Var6._M_pi = BVar10.m_data.
                      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
      }
      else {
        BVar10 = detail::const_var_impl<unsigned_long>((unsigned_long *)t);
        _Var6._M_pi = BVar10.m_data.
                      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
      }
      goto LAB_00549be5;
    }
  }
  else {
    if ((pointer)(long)(int)local_60._M_dataplus._M_p == pcVar5 && !bVar2) {
      BVar10 = detail::const_var_impl<int>((int *)t);
      _Var6._M_pi = BVar10.m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      goto LAB_00549be5;
    }
    if (((int)t_val._M_len == 10) || ((ulong)pcVar5 >> 0x20 != 0 || bVar2)) {
      if (bVar3) {
        BVar10 = detail::const_var_impl<long_long>((longlong *)t);
        _Var6._M_pi = BVar10.m_data.
                      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
      }
      else {
        BVar10 = detail::const_var_impl<long>((long *)t);
        _Var6._M_pi = BVar10.m_data.
                      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
      }
      goto LAB_00549be5;
    }
  }
  BVar10 = detail::const_var_impl<unsigned_int>((uint *)t);
  _Var6._M_pi = BVar10.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
LAB_00549be5:
  BVar10.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var6._M_pi;
  BVar10.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = t;
  return (Boxed_Value)
         BVar10.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

static Boxed_Value buildInt(const int base, std::string_view t_val, const bool prefixed) {
        bool unsigned_ = false;
        bool long_ = false;
        bool longlong_ = false;

        auto i = t_val.size();

        for (; i > 0; --i) {
          const char val = t_val[i - 1];

          if (val == 'u' || val == 'U') {
            unsigned_ = true;
          } else if (val == 'l' || val == 'L') {
            if (long_) {
              longlong_ = true;
            }

            long_ = true;
          } else {
            break;
          }
        }

        if (prefixed) {
          t_val.remove_prefix(2);
        }

#ifdef __GNUC__
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wsign-compare"

#ifdef CHAISCRIPT_CLANG
#pragma GCC diagnostic ignored "-Wtautological-compare"
#pragma GCC diagnostic ignored "-Wtautological-unsigned-zero-compare"
#pragma GCC diagnostic ignored "-Wtautological-type-limit-compare"
#pragma GCC diagnostic ignored "-Wsign-conversion"
#endif

#endif

        try {
          /// TODO fix this to use from_chars
          auto u = std::stoll(std::string(t_val), nullptr, base);

          if (!unsigned_ && !long_ && u >= std::numeric_limits<int>::min() && u <= std::numeric_limits<int>::max()) {
            return const_var(static_cast<int>(u));
          } else if ((unsigned_ || base != 10) && !long_ && u >= std::numeric_limits<unsigned int>::min()
                     && u <= std::numeric_limits<unsigned int>::max()) {
            return const_var(static_cast<unsigned int>(u));
          } else if (!unsigned_ && !longlong_ && u >= std::numeric_limits<long>::min() && u <= std::numeric_limits<long>::max()) {
            return const_var(static_cast<long>(u));
          } else if ((unsigned_ || base != 10) && !longlong_ && u >= std::numeric_limits<unsigned long>::min()
                     && u <= std::numeric_limits<unsigned long>::max()) {
            return const_var(static_cast<unsigned long>(u));
          } else if (!unsigned_ && u >= std::numeric_limits<long long>::min() && u <= std::numeric_limits<long long>::max()) {
            return const_var(static_cast<long long>(u));
          } else {
            return const_var(static_cast<unsigned long long>(u));
          }

        } catch (const std::out_of_range &) {
          // too big to be signed
          try {
            /// TODO fix this to use from_chars
            auto u = std::stoull(std::string(t_val), nullptr, base);

            if (!longlong_ && u >= std::numeric_limits<unsigned long>::min() && u <= std::numeric_limits<unsigned long>::max()) {
              return const_var(static_cast<unsigned long>(u));
            } else {
              return const_var(static_cast<unsigned long long>(u));
            }
          } catch (const std::out_of_range &) {
            // it's just simply too big
            return const_var(std::numeric_limits<long long>::max());
          }
        }

#ifdef __GNUC__
#pragma GCC diagnostic pop
#endif
      }